

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,duckdb::MedianAbsoluteDeviationOperation<double>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  iterator iVar4;
  ulong uVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong uVar10;
  AggregateUnaryInput input_data;
  ulong local_a0;
  double local_98;
  idx_t local_90;
  ulong local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar7 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      local_a0 = 0;
      uVar9 = 0;
      local_90 = count;
      local_80 = pdVar7;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar8 = pdVar7;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar5 = count;
          }
LAB_01a5449e:
          uVar6 = uVar9;
          if (uVar9 < uVar5) {
            do {
              local_78.sel = *(SelectionVector **)(pdVar7 + uVar9 * 8);
              iVar4._M_current = *(double **)(state + 8);
              if (iVar4._M_current == *(double **)(state + 0x10)) {
                ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)state,iVar4,
                           (double *)&local_78);
              }
              else {
                *iVar4._M_current = (double)local_78.sel;
                *(double **)(state + 8) = iVar4._M_current + 1;
              }
              uVar9 = uVar9 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar9);
          }
        }
        else {
          uVar2 = puVar1[local_a0];
          uVar5 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar5 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_01a5449e;
          uVar6 = uVar5;
          if ((uVar2 != 0) && (uVar6 = uVar9, count = local_90, uVar9 < uVar5)) {
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                local_78.sel = *(SelectionVector **)(pdVar7 + uVar10 * 8 + uVar9 * 8);
                iVar4._M_current = *(double **)(state + 8);
                if (iVar4._M_current == *(double **)(state + 0x10)) {
                  ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            ((vector<double,_std::allocator<double>_> *)state,iVar4,
                             (double *)&local_78);
                  pdVar8 = local_80;
                }
                else {
                  *iVar4._M_current = (double)local_78.sel;
                  *(double **)(state + 8) = iVar4._M_current + 1;
                }
              }
              uVar10 = uVar10 + 1;
              uVar6 = uVar5;
              count = local_90;
            } while (uVar5 - uVar9 != uVar10);
          }
        }
        local_a0 = local_a0 + 1;
        pdVar7 = pdVar8;
        uVar9 = uVar6;
      } while (local_a0 != local_88);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      QuantileOperation::
      ConstantOperation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<double>>
                ((QuantileState<double,_duckdb::QuantileStandardType> *)state,(double *)input->data,
                 (AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        uVar9 = 0;
        do {
          uVar5 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar5 = (ulong)psVar3[uVar9];
          }
          local_98 = *(double *)(local_78.data + uVar5 * 8);
          iVar4._M_current = *(double **)(state + 8);
          if (iVar4._M_current == *(double **)(state + 0x10)) {
            ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)state,iVar4,&local_98);
          }
          else {
            *iVar4._M_current = local_98;
            *(double **)(state + 8) = iVar4._M_current + 1;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      uVar9 = 0;
      do {
        uVar5 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar3[uVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
             >> (uVar5 & 0x3f) & 1) != 0)) {
          local_98 = *(double *)(local_78.data + uVar5 * 8);
          iVar4._M_current = *(double **)(state + 8);
          if (iVar4._M_current == *(double **)(state + 0x10)) {
            ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)state,iVar4,&local_98);
          }
          else {
            *iVar4._M_current = local_98;
            *(double **)(state + 8) = iVar4._M_current + 1;
          }
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}